

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse::GetAsyncCommandResponse
          (GetAsyncCommandResponse *this)

{
  pointer *__ptr_4;
  pointer *__ptr;
  pointer *__ptr_1;
  pointer *__ptr_3;
  pointer *__ptr_2;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GetAsyncCommandResponse_003a3368;
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>::CopyablePtr
            (&this->setup_tracing_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource>::
  CopyablePtr(&this->setup_data_source_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StartDataSource>::
  CopyablePtr(&this->start_data_source_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource>::CopyablePtr
            (&this->stop_data_source_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush>::CopyablePtr
            (&this->flush_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_ClearIncrementalState>::
  CopyablePtr(&this->clear_incremental_state_);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

GetAsyncCommandResponse::GetAsyncCommandResponse() = default;